

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall DnsStats::~DnsStats(DnsStats *this)

{
  BinHash<DnsNameEntry>::Clear(&this->nameList);
  BinHash<StatsByIP>::Clear(&this->statsByIp);
  BinHash<DnssecPrefixEntry>::Clear(&this->dnssecPrefixTable);
  BinHash<DnsPrefixEntry>::Clear(&this->dnsPrefixTable);
  LruHash<TldAsKey>::~LruHash(&this->tldStringUsage);
  BinHash<TldAsKey>::Clear(&this->registeredTld);
  BinHash<TldAddressAsKey>::Clear(&this->queryUsage);
  LruHash<TldAsKey>::~LruHash(&this->secondLdLeakage);
  LruHash<TldAsKey>::~LruHash(&this->tldLeakage);
  AddressUseTracker::~AddressUseTracker(&this->frequentAddresses);
  AddressFilter::~AddressFilter(&this->bannedAddresses);
  AddressFilter::~AddressFilter(&this->allowedAddresses);
  AddressFilter::~AddressFilter(&this->rootAddresses);
  BinHash<DnsHashEntry>::Clear(&this->hashTable);
  return;
}

Assistant:

DnsStats::~DnsStats()
{
}